

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::dec_int(sequence *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  uchar local_14a [2];
  maybe local_148;
  repeat_at_least local_138;
  character_in_range local_120;
  digit local_110;
  sequence local_f8;
  either local_d8;
  sequence local_b8;
  either local_98;
  character_either local_78;
  character local_58;
  digit local_48;
  digit local_30;
  
  local_14a[0] = '-';
  local_14a[1] = '+';
  cs._M_len = 2;
  cs._M_array = local_14a;
  character_either::character_either(&local_78,cs);
  maybe::maybe<toml::detail::character_either>(&local_148,&local_78);
  local_120.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004daa00;
  local_120.from_ = '1';
  local_120.to_ = '9';
  local_110.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004db830;
  local_110.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004daa00;
  local_110.scanner_.from_ = '0';
  local_110.scanner_.to_ = '9';
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004da940;
  local_58.value_ = '_';
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004db830;
  local_30.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004daa00;
  local_30.scanner_.from_ = '0';
  local_30.scanner_.to_ = '9';
  sequence::sequence<toml::detail::character,toml::detail::syntax::digit>
            (&local_f8,&local_58,&local_30);
  either::either<toml::detail::syntax::digit,toml::detail::sequence>(&local_d8,&local_110,&local_f8)
  ;
  repeat_at_least::repeat_at_least<toml::detail::either>(&local_138,1,&local_d8);
  sequence::sequence<toml::detail::character_in_range,toml::detail::repeat_at_least>
            (&local_b8,&local_120,&local_138);
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004db830;
  local_48.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004daa00;
  local_48.scanner_.from_ = '0';
  local_48.scanner_.to_ = '9';
  either::either<toml::detail::sequence,toml::detail::syntax::digit>(&local_98,&local_b8,&local_48);
  sequence::sequence<toml::detail::maybe,toml::detail::either>
            (__return_storage_ptr__,&local_148,&local_98);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_98.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_b8.others_);
  if (local_138.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_138.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_138.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_d8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f8.others_);
  if (local_148.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_148.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_148.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78.chars_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence dec_int(const spec& s)
{
    const auto digit19 = []() {
        return character_in_range(char_type('1'), char_type('9'));
    };
    return sequence(
            maybe(character_either{char_type('-'), char_type('+')}),
            either(
                sequence(
                    digit19(),
                    repeat_at_least(1,
                        either(
                            digit(s),
                            sequence(character(char_type('_')), digit(s))
                        )
                    )
                ),
                digit(s)
            )
        );
}